

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::FindPropertyIndex(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
                    *this,ValueType *name,SizeType *outIndex)

{
  SizeType SVar1;
  SizeType SVar2;
  int iVar3;
  Ch *__s2;
  Ch *__s1;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  
  SVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetStringLength(name);
  __s2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         ::GetString(name);
  bVar6 = this->propertyCount_ != 0;
  if (bVar6) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      SVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetStringLength
                        ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                         ((long)&(this->properties_->name).data_ + lVar4));
      if (SVar2 == SVar1) {
        __s1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                         ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                          ((long)&(this->properties_->name).data_ + lVar4));
        iVar3 = bcmp(__s1,__s2,(ulong)SVar1);
        if (iVar3 == 0) {
          *outIndex = (SizeType)uVar5;
          return bVar6;
        }
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x38;
      bVar6 = uVar5 < this->propertyCount_;
    } while (bVar6);
  }
  return bVar6;
}

Assistant:

bool FindPropertyIndex(const ValueType& name, SizeType* outIndex) const {
        SizeType len = name.GetStringLength();
        const Ch* str = name.GetString();
        for (SizeType index = 0; index < propertyCount_; index++)
            if (properties_[index].name.GetStringLength() == len &&
                (std::memcmp(properties_[index].name.GetString(), str, sizeof(Ch) * len) == 0))
            {
                *outIndex = index;
                return true;
            }
        return false;
    }